

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IRRImporter::ComputeAnimations
          (IRRImporter *this,Node *root,aiNode *real,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims)

{
  char *__s;
  undefined8 *puVar1;
  float *pfVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  iterator __position;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  aiNode *paVar11;
  ai_uint32 aVar12;
  uint uVar13;
  Logger *pLVar14;
  aiNode *paVar15;
  aiNode *this_00;
  aiNode *paVar16;
  aiNode **ppaVar17;
  aiVectorKey *paVar18;
  aiQuatKey *paVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  aiQuatKey *paVar27;
  iterator it;
  _List_node_base *p_Var28;
  long lVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  float fVar34;
  _List_node_base *p_Var35;
  uint uVar36;
  float fVar37;
  float fVar38;
  uint uVar41;
  double dVar39;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  aiQuaternion aVar40;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  int iVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar48;
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  aiNode *local_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  int local_ec;
  IRRImporter *local_e8;
  _List_node_base *local_e0;
  ulong local_d8;
  Node *local_d0;
  float local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  aiNode *local_58;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_e8 = this;
  local_d0 = root;
  if ((root == (Node *)0x0) || (real == (aiNode *)0x0)) {
    __assert_fail("nullptr != root && nullptr != real",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Irr/IRRLoader.cpp"
                  ,0x137,
                  "void Assimp::IRRImporter::ComputeAnimations(Node *, aiNode *, std::vector<aiNodeAnim *> &)"
                 );
  }
  p_Var35 = (_List_node_base *)&root->animators;
  p_Var28 = (root->animators).
            super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var28 != p_Var35) {
    uVar20 = 0;
    local_58 = real;
    do {
      if ((*(int *)&p_Var28[1]._M_next == 5) || (*(int *)&p_Var28[1]._M_next == 0)) {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"IRR: Skipping unknown or unsupported animator");
      }
      else {
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      p_Var28 = p_Var28->_M_next;
    } while (p_Var28 != p_Var35);
    if ((int)uVar20 != 0) {
      if ((int)uVar20 == 1) {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"IRR: Adding dummy nodes to simulate multiple animators");
      }
      p_Var28 = (((list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                   *)p_Var35)->
                super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var28 != p_Var35) {
        local_ec = 0;
        local_e0 = p_Var35;
        local_50 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)anims;
        do {
          if ((*(int *)&p_Var28[1]._M_next == 0) || (*(int *)&p_Var28[1]._M_next == 5))
          goto LAB_004124f8;
          paVar15 = (aiNode *)operator_new(0x438);
          (paVar15->mName).length = 0;
          __s = (paVar15->mName).data;
          (paVar15->mName).data[0] = '\0';
          memset((paVar15->mName).data + 1,0x1b,0x3ff);
          paVar11 = local_58;
          *(aiQuatKey **)&(paVar15->mTransformation).b2 = (aiQuatKey *)0x0;
          (paVar15->mTransformation).b4 = 0.0;
          (paVar15->mTransformation).a1 = 0.0;
          (paVar15->mTransformation).a2 = 0.0;
          (paVar15->mTransformation).a3 = 0.0;
          (paVar15->mTransformation).a4 = 0.0;
          *(undefined1 (*) [16])&(paVar15->mTransformation).c2 = (undefined1  [16])0x0;
          uVar21 = (local_d0->name)._M_string_length;
          local_110 = paVar15;
          local_d8 = uVar20;
          if (local_ec == (int)uVar20 + -1) {
            if (uVar21 < 0x400) {
              (paVar15->mName).length = (ai_uint32)uVar21;
              memcpy(__s,(local_d0->name)._M_dataplus._M_p,uVar21);
              (paVar15->mName).data[uVar21] = '\0';
            }
          }
          else {
            aVar12 = snprintf(__s,0x400,"$INST_DUMMY_%i_%s");
            (local_110->mName).length = aVar12;
            this_00 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_00);
            paVar15 = local_110;
            paVar16 = paVar11->mParent;
            if (paVar16->mNumChildren != 0) {
              uVar20 = 0;
              do {
                if (paVar16->mChildren[uVar20] == paVar11) {
                  paVar16->mChildren[uVar20] = this_00;
                  paVar16 = paVar11->mParent;
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 < paVar16->mNumChildren);
            }
            this_00->mParent = paVar16;
            if (this_00 != local_110) {
              uVar13 = (local_110->mName).length;
              (this_00->mName).length = uVar13;
              memcpy((this_00->mName).data,(local_110->mName).data,(ulong)uVar13);
              (this_00->mName).data[uVar13] = '\0';
            }
            this_00->mNumChildren = 1;
            ppaVar17 = (aiNode **)operator_new__(8);
            this_00->mChildren = ppaVar17;
            *ppaVar17 = paVar11;
            paVar11->mParent = this_00;
          }
          switch(*(undefined4 *)&p_Var28[1]._M_next) {
          case 1:
            uVar4 = *(undefined8 *)((long)&p_Var28[1]._M_prev + 4);
            uVar36 = (uint)((float)uVar4 * 100.0);
            uVar41 = (uint)((float)((ulong)uVar4 >> 0x20) * 100.0);
            iVar42 = (int)((ulong)uVar36 * 0xb60b60b7 >> 0x20) -
                     (-(uint)((int)uVar36 < 0) & 0xb60b60b7);
            iVar23 = (int)((ulong)uVar41 * 0xb60b60b7 >> 0x20) -
                     (-(uint)((int)uVar41 < 0) & 0xb60b60b7);
            uVar36 = uVar36 - ((iVar42 >> 8) - (iVar42 >> 0x1f)) * (int)DAT_0075ec20;
            uVar41 = uVar41 - ((iVar23 >> 8) - (iVar23 >> 0x1f)) * (int)DAT_0075ec20;
            uVar13 = (int)(*(float *)&p_Var28[1]._M_prev * 100.0) % 0x168;
            if ((uVar13 == 0 || uVar36 == 0) || (uVar41 * uVar36 == 0)) {
              if (uVar13 != 0) {
                uVar20 = (ulong)uVar36;
                uVar21 = (ulong)uVar13;
                goto LAB_00412172;
              }
              if (uVar36 != 0) {
                fVar34 = 0.0;
                bVar8 = true;
                uVar20 = (ulong)uVar36;
                uVar13 = 0x168;
                goto LAB_004121bc;
              }
              if (uVar41 == 0) goto switchD_00411817_default;
              uVar13 = 0x168;
              fVar34 = 0.0;
              bVar9 = true;
              bVar8 = true;
              fVar37 = 0.0;
LAB_0041220e:
              uVar20 = (ulong)uVar41;
              uVar21 = (ulong)uVar13;
              do {
                uVar30 = (uint)uVar21;
                uVar20 = (long)(int)uVar20 % (long)(int)uVar30;
                uVar25 = (uint)uVar20;
                uVar36 = uVar30;
                if (uVar25 == 0) break;
                uVar20 = uVar20 & 0xffffffff;
                uVar21 = (long)(int)uVar30 % (long)(int)uVar25 & 0xffffffff;
                uVar36 = uVar25;
              } while ((int)((long)(int)uVar30 % (long)(int)uVar25) != 0);
LAB_0041223a:
              uVar13 = ((int)uVar13 / (int)uVar36) * uVar41;
              fVar38 = (float)(int)uVar41;
              bVar10 = false;
            }
            else {
              uVar20 = 3;
              uVar21 = 3;
              if (((2 < (int)uVar13) && (uVar21 = 10, 9 < uVar13)) && (uVar21 = 0x14, 0x13 < uVar13)
                 ) {
                if (uVar13 < 0x1f) {
                  uVar13 = 0x1e;
                }
                uVar21 = (ulong)uVar13;
              }
              if (((2 < (int)uVar36) && (uVar20 = 10, 9 < uVar36)) && (uVar20 = 0x14, 0x13 < uVar36)
                 ) {
                if (uVar36 < 0x1f) {
                  uVar36 = 0x1e;
                }
                uVar20 = (ulong)uVar36;
              }
              if ((int)uVar41 < 3) {
                uVar41 = 3;
              }
              else if (uVar41 < 10) {
                uVar41 = 10;
              }
              else if (uVar41 < 0x14) {
                uVar41 = 0x14;
              }
              else if (uVar41 < 0x1f) {
                uVar41 = 0x1e;
              }
LAB_00412172:
              iVar33 = (int)uVar20;
              iVar42 = 0x168;
              iVar23 = (int)uVar21;
              do {
                uVar7 = (long)(int)uVar21 % (long)iVar42;
                uVar21 = uVar7 & 0xffffffff;
                iVar24 = (int)uVar7;
                iVar31 = iVar42;
                if (iVar24 == 0) break;
                iVar42 = iVar42 % iVar24;
                iVar31 = iVar24;
              } while (iVar42 != 0);
              uVar36 = 0;
              uVar13 = (int)(0x168 / (long)iVar31) * iVar23;
              fVar34 = (float)iVar23;
              if (iVar33 == 0) {
                fVar37 = 0.0;
                bVar9 = true;
                bVar8 = false;
              }
              else {
                bVar8 = false;
                iVar42 = iVar33;
                if (uVar13 != 0) {
LAB_004121bc:
                  uVar36 = uVar13;
                  iVar33 = (int)uVar20;
                  uVar21 = (ulong)uVar36;
                  do {
                    iVar31 = (int)uVar21;
                    uVar20 = (long)(int)uVar20 % (long)iVar31;
                    iVar23 = (int)uVar20;
                    iVar42 = iVar31;
                    if (iVar23 == 0) break;
                    uVar20 = uVar20 & 0xffffffff;
                    uVar21 = (long)iVar31 % (long)iVar23 & 0xffffffff;
                    iVar42 = iVar23;
                  } while ((int)((long)iVar31 % (long)iVar23) != 0);
                }
                uVar13 = ((int)uVar36 / iVar42) * iVar33;
                fVar37 = (float)iVar33;
                bVar9 = false;
              }
              if (uVar41 != 0) {
                if (uVar13 != 0) goto LAB_0041220e;
                uVar13 = 0;
                uVar36 = uVar41;
                goto LAB_0041223a;
              }
              fVar38 = 0.0;
              bVar10 = true;
            }
            if (uVar13 == 0x168) goto switchD_00411817_default;
            fVar49 = (float)(int)uVar13;
            fVar48 = 0.0;
            if (!bVar8) {
              fVar48 = fVar49 / fVar34;
            }
            fVar34 = fVar48;
            if ((!bVar9) && (fVar34 = fVar49 / fVar37, fVar49 / fVar37 <= fVar48)) {
              fVar34 = fVar48;
            }
            fVar37 = fVar34;
            if ((!bVar10) && (fVar37 = fVar49 / fVar38, fVar49 / fVar38 <= fVar34)) {
              fVar37 = fVar34;
            }
            uVar20 = (ulong)((double)fVar37 * local_e8->fps);
            fVar34 = (float)uVar20;
            (paVar15->mTransformation).a4 = fVar34;
            uVar20 = uVar20 & 0xffffffff;
            paVar19 = (aiQuatKey *)operator_new__(uVar20 * 0x18);
            aVar40._0_12_ = ZEXT812(0x3f800000);
            aVar40.z = 0.0;
            if (fVar34 != 0.0) {
              paVar27 = paVar19;
              do {
                paVar27->mTime = 0.0;
                paVar27->mValue = aVar40;
                paVar27 = paVar27 + 1;
              } while (paVar27 != paVar19 + uVar20);
            }
            *(aiQuatKey **)&(paVar15->mTransformation).b2 = paVar19;
            if ((paVar15->mTransformation).a4 != 0.0) {
              local_108._0_4_ = 0.0;
              fStack_a4 = 0.0;
              fStack_a0 = 0.0;
              fStack_9c = 0.0;
              local_c8 = 0.0;
              lVar29 = 8;
              uVar20 = 0;
              do {
                local_108._4_4_ = fStack_a4;
                fStack_100 = fStack_a0;
                fStack_fc = fStack_9c;
                paVar19 = *(aiQuatKey **)&(paVar15->mTransformation).b2;
                local_a8 = (float)local_108._0_4_ * 0.5;
                local_68 = sinf(local_a8);
                fStack_64 = extraout_XMM0_Db;
                fStack_60 = extraout_XMM0_Dc;
                fStack_5c = extraout_XMM0_Dd;
                local_a8 = cosf(local_a8);
                local_b8 = (float)local_108._4_4_ * 0.5;
                fStack_b4 = (float)local_108._4_4_;
                fStack_b0 = (float)local_108._4_4_;
                fStack_ac = (float)local_108._4_4_;
                fVar34 = sinf(local_b8);
                local_78 = (double)CONCAT44(extraout_XMM0_Db_00,fVar34);
                local_b8 = cosf(local_b8);
                local_98 = local_c8 * 0.5;
                fStack_b4 = extraout_XMM0_Db_01;
                fStack_b0 = extraout_XMM0_Dc_00;
                fStack_ac = extraout_XMM0_Dd_00;
                local_88 = sinf(local_98);
                fStack_84 = extraout_XMM0_Db_02;
                fStack_80 = extraout_XMM0_Dc_01;
                fStack_7c = extraout_XMM0_Dd_01;
                fVar34 = cosf(local_98);
                pfVar2 = (float *)((long)&paVar19->mTime + lVar29);
                *pfVar2 = fVar34 * local_b8 * local_a8 + local_88 * (float)local_78 * local_68;
                pfVar2[1] = local_88 * local_b8 * local_a8 + -fVar34 * (float)local_78 * local_68;
                pfVar2[2] = local_b8 * fVar34 * local_68 + (float)local_78 * local_88 * local_a8;
                pfVar2[3] = (float)local_78 * fVar34 * local_a8 + local_b8 * -local_88 * local_68;
                *(double *)((long)paVar19 + lVar29 + -8) = (double)(uVar20 & 0xffffffff);
                local_108._0_4_ = (float)local_108._0_4_ + SUB84(p_Var28[1]._M_prev,0);
                fStack_a4 = (float)local_108._4_4_ + (float)((ulong)p_Var28[1]._M_prev >> 0x20);
                fStack_a0 = fStack_100 + 0.0;
                fStack_9c = fStack_fc + 0.0;
                local_108._4_4_ = fStack_a4;
                fStack_100 = fStack_a0;
                fStack_fc = fStack_9c;
                local_c8 = local_c8 + *(float *)&p_Var28[2]._M_next;
                uVar20 = uVar20 + 1;
                lVar29 = lVar29 + 0x18;
                paVar15 = local_110;
              } while (uVar20 < (uint)(local_110->mTransformation).a4);
            }
            goto LAB_004124b1;
          case 2:
            local_108 = (undefined1  [8])local_e8->fps;
            uVar20 = (ulong)(((1.0 / (double)*(float *)((long)&p_Var28[1]._M_next + 4)) / 1000.0) *
                            local_e8->fps);
            fVar34 = (float)uVar20;
            (paVar15->mTransformation).a1 = fVar34;
            uVar20 = (uVar20 & 0xffffffff) * 0x18;
            paVar18 = (aiVectorKey *)operator_new__(uVar20);
            if (fVar34 != 0.0) {
              uVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)&paVar18->mTime + uVar21);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)&(paVar18->mValue).z + uVar21) = 0;
                uVar21 = uVar21 + 0x18;
              } while (uVar20 != uVar21);
            }
            *(aiVectorKey **)&(paVar15->mTransformation).a2 = paVar18;
            uVar4 = *(undefined8 *)((long)&p_Var28[1]._M_prev + 4);
            fVar34 = (float)uVar4;
            fVar37 = (float)((ulong)uVar4 >> 0x20);
            if ((fVar34 != 0.0) || (NAN(fVar34))) {
              fVar49 = fVar37 * 0.0 + fVar34 * -0.0;
              fVar38 = *(float *)&p_Var28[1]._M_prev;
              auVar47._0_4_ = fVar37 * -50.0;
              auVar47._4_4_ = fVar38 * -0.0;
              auVar47._8_4_ = fVar37 * 0.0;
              auVar47._12_4_ = fVar37 * 0.0;
              fVar48 = fVar34 * 50.0;
            }
            else {
              fVar49 = fVar37 * 50.0 + (float)((uint)-fVar34 & 0x80000000);
              fVar38 = *(float *)&p_Var28[1]._M_prev;
              auVar47._0_4_ = fVar37 * -0.0;
              auVar47._4_4_ = fVar38 * -50.0;
              auVar47._8_4_ = fVar37 * 0.0;
              auVar47._12_4_ = fVar37 * 0.0;
              fVar48 = fVar34 * 0.0;
            }
            fVar44 = fVar38 * 0.0 + auVar47._0_4_;
            fVar48 = fVar48 + auVar47._4_4_;
            if ((paVar15->mTransformation).a1 != 0.0) {
              local_78 = 1000.0 / (double)local_108;
              fVar50 = 1.0 / SQRT(fVar48 * fVar48 + fVar49 * fVar49 + fVar44 * fVar44);
              local_98 = fVar49 * fVar50;
              fStack_94 = fVar50 * fVar44;
              local_b8 = fVar50 * fVar48;
              local_88 = fVar37 * fStack_94 - fVar34 * local_b8;
              fStack_84 = fVar38 * local_b8 - fVar37 * local_98;
              local_48 = local_98 * fVar34 - fVar38 * fStack_94;
              fStack_7c = 1.0 / SQRT(local_48 * local_48 +
                                     local_88 * local_88 + fStack_84 * fStack_84);
              local_48 = local_48 * fStack_7c;
              local_88 = fStack_7c * local_88;
              fStack_84 = fStack_7c * fStack_84;
              fStack_80 = fStack_7c * (fVar37 * fVar50 * (auVar47._8_4_ + 0.0) - local_b8 * 0.0);
              fStack_7c = fStack_7c *
                          (fVar37 * fVar50 * (fVar37 * 0.0 + auVar47._12_4_) - local_b8 * 0.0);
              lVar29 = 0x10;
              uVar20 = 0;
              fStack_b4 = local_b8;
              fStack_b0 = local_b8;
              fStack_ac = local_b8;
              fStack_90 = local_b8;
              fStack_8c = local_b8;
              fStack_44 = fVar37;
              fStack_40 = fVar37;
              fStack_3c = fVar37;
              do {
                paVar18 = *(aiVectorKey **)&(paVar15->mTransformation).a2;
                dVar39 = (double)(uVar20 & 0xffffffff) * local_78;
                *(double *)((long)paVar18 + lVar29 + -0x10) = dVar39;
                local_a8 = (float)((double)*(float *)((long)&p_Var28[1]._M_next + 4) * dVar39);
                _local_108 = ZEXT416(*(uint *)&p_Var28[3]._M_next);
                local_c8 = cosf(local_a8);
                local_68 = local_48 * local_c8;
                fStack_64 = fStack_44;
                fStack_60 = fStack_40;
                fStack_5c = fStack_3c;
                fVar37 = sinf(local_a8);
                uVar4 = *(undefined8 *)((long)&p_Var28[2]._M_next + 4);
                fVar34 = *(float *)((long)&p_Var28[2]._M_prev + 4);
                *(ulong *)((long)paVar18 + lVar29 + -8) =
                     CONCAT44((float)((ulong)uVar4 >> 0x20) +
                              (float)local_108._0_4_ * (fVar37 * fStack_94 + local_c8 * fStack_84),
                              (float)uVar4 +
                              (float)local_108._0_4_ * (fVar37 * local_98 + local_c8 * local_88));
                *(float *)((long)&paVar18->mTime + lVar29) =
                     (local_b8 * fVar37 + local_68) * (float)local_108._0_4_ + fVar34;
                uVar20 = uVar20 + 1;
                lVar29 = lVar29 + 0x18;
                paVar15 = local_110;
              } while (uVar20 < (uint)(local_110->mTransformation).a1);
            }
LAB_004124b1:
            (paVar15->mTransformation).c4 = 4.2039e-45;
            (paVar15->mTransformation).d1 = 4.2039e-45;
LAB_004124c2:
            __position._M_current = *(aiNodeAnim ***)(local_50 + 8);
            if (__position._M_current == *(aiNodeAnim ***)(local_50 + 0x10)) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>(local_50,__position,(aiNodeAnim **)&local_110);
            }
            else {
              *__position._M_current = (aiNodeAnim *)paVar15;
              *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
            }
            uVar20 = (ulong)((int)local_d8 + 1);
            break;
          case 3:
            fVar34 = (float)((uint)*(byte *)&p_Var28[5]._M_next * 2 + aiAnimBehaviour_CONSTANT);
            (paVar15->mTransformation).c4 = fVar34;
            (paVar15->mTransformation).d1 = fVar34;
            local_108 = (undefined1  [8])local_e8->fps;
            uVar20 = (ulong)(((double)*(int *)((long)&p_Var28[5]._M_next + 4) / 1000.0) *
                            local_e8->fps);
            fVar34 = (float)uVar20;
            (paVar15->mTransformation).a1 = fVar34;
            uVar20 = (uVar20 & 0xffffffff) * 0x18;
            paVar18 = (aiVectorKey *)operator_new__(uVar20);
            if (fVar34 != 0.0) {
              uVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)&paVar18->mTime + uVar21);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)&(paVar18->mValue).z + uVar21) = 0;
                uVar21 = uVar21 + 0x18;
              } while (uVar20 != uVar21);
            }
            *(aiVectorKey **)&(paVar15->mTransformation).a2 = paVar18;
            if ((paVar15->mTransformation).a1 != 0.0) {
              uVar4 = *(undefined8 *)((long)&p_Var28[2]._M_next + 4);
              fVar38 = SUB84(p_Var28[1]._M_prev,0) - (float)uVar4;
              fVar48 = (float)((ulong)p_Var28[1]._M_prev >> 0x20) - (float)((ulong)uVar4 >> 0x20);
              fVar34 = *(float *)&p_Var28[2]._M_next - *(float *)((long)&p_Var28[2]._M_prev + 4);
              fVar49 = SQRT(fVar34 * fVar34 + fVar38 * fVar38 + fVar48 * fVar48);
              fVar37 = 1.0 / fVar49;
              iVar42 = *(int *)((long)&p_Var28[5]._M_next + 4);
              lVar29 = 0x10;
              uVar20 = 0;
              do {
                paVar18 = *(aiVectorKey **)&(paVar15->mTransformation).a2;
                dVar39 = (double)(uVar20 & 0xffffffff) * (1000.0 / (double)local_108);
                *(double *)((long)paVar18 + lVar29 + -0x10) = dVar39;
                fVar50 = (float)(dVar39 * (double)(fVar49 / (float)iVar42));
                uVar4 = *(undefined8 *)((long)&p_Var28[2]._M_next + 4);
                fVar44 = *(float *)((long)&p_Var28[2]._M_prev + 4);
                *(ulong *)((long)paVar18 + lVar29 + -8) =
                     CONCAT44((float)((ulong)uVar4 >> 0x20) + fVar50 * fVar37 * fVar48,
                              (float)uVar4 + fVar50 * fVar37 * fVar38);
                *(float *)((long)&paVar18->mTime + lVar29) = fVar34 * fVar37 * fVar50 + fVar44;
                uVar20 = uVar20 + 1;
                lVar29 = lVar29 + 0x18;
                paVar15 = local_110;
              } while (uVar20 < (uint)(local_110->mTransformation).a1);
            }
            goto LAB_004124c2;
          case 4:
            (paVar15->mTransformation).c4 = 4.2039e-45;
            (paVar15->mTransformation).d1 = 4.2039e-45;
            iVar42 = (int)((ulong)((long)p_Var28[4]._M_next - (long)p_Var28[3]._M_prev) >> 3);
            fVar34 = (float)(iVar42 * -0x55555555);
            if (fVar34 == 1.4013e-45) {
              (paVar15->mTransformation).a1 = 1.4013e-45;
              paVar18 = (aiVectorKey *)operator_new__(0x18);
              paVar18->mTime = 0.0;
              (paVar18->mValue).x = 0.0;
              (paVar18->mValue).y = 0.0;
              (paVar18->mValue).z = 0.0;
              *(aiVectorKey **)&(paVar15->mTransformation).a2 = paVar18;
              p_Var35 = p_Var28[3]._M_prev;
              *(_List_node_base **)&paVar18->mValue = p_Var35->_M_prev;
              (paVar18->mValue).z = *(float *)&p_Var35[1]._M_next;
              (*(aiVectorKey **)&(paVar15->mTransformation).a2)->mTime = 0.0;
              paVar15 = local_110;
              goto switchD_00411817_default;
            }
            if (fVar34 != 0.0) {
              uVar20 = (ulong)(local_e8->fps * 15.0);
              fVar37 = (float)uVar20;
              (paVar15->mTransformation).a1 = fVar37;
              uVar20 = (uVar20 & 0xffffffff) * 0x18;
              paVar18 = (aiVectorKey *)operator_new__(uVar20);
              if (fVar37 != 0.0) {
                uVar21 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar18->mTime + uVar21);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar18->mValue).z + uVar21) = 0;
                  uVar21 = uVar21 + 0x18;
                } while (uVar20 != uVar21);
              }
              *(aiVectorKey **)&(paVar15->mTransformation).a2 = paVar18;
              if ((paVar15->mTransformation).a1 != 0.0) {
                local_c8 = (float)-((int)fVar34 >> 0x1f & (uint)fVar34);
                lVar29 = 0x10;
                uVar20 = 0;
                do {
                  paVar18 = *(aiVectorKey **)&(paVar15->mTransformation).a2;
                  fVar37 = (float)(uVar20 & 0xffffffff) * *(float *)((long)&p_Var28[1]._M_next + 4)
                           * 0.001;
                  local_108._0_4_ = fVar37;
                  fVar38 = floorf(fVar37);
                  iVar23 = (int)fVar38 % (int)fVar34;
                  fVar37 = local_c8;
                  if (iVar23 < 1) {
                    fVar37 = fVar34;
                  }
                  p_Var35 = p_Var28[3]._M_prev;
                  fVar48 = local_c8;
                  if (iVar23 < 0) {
                    fVar48 = fVar34;
                  }
                  lVar22 = (long)(iVar23 + -1 + (int)fVar37);
                  fVar37 = fVar34;
                  if (SBORROW4(iVar23 + 1,(int)fVar34) != iVar23 + 1 + iVar42 * 0x55555555 < 0) {
                    fVar37 = 0.0;
                  }
                  fVar37 = (float)-(int)fVar37;
                  if (iVar23 < -1) {
                    fVar37 = fVar34;
                  }
                  fVar49 = fVar34;
                  if (SBORROW4(iVar23 + 2,(int)fVar34) != iVar23 + 2 + iVar42 * 0x55555555 < 0) {
                    fVar49 = 0.0;
                  }
                  lVar32 = (long)(int)((int)fVar37 + 1U + iVar23);
                  fVar44 = ((float)local_108._0_4_ - fVar38) * ((float)local_108._0_4_ - fVar38);
                  fVar38 = fVar44 + fVar44;
                  fVar37 = (float)-(int)fVar49;
                  if (iVar23 < -2) {
                    fVar37 = fVar34;
                  }
                  fVar45 = fVar38 + fVar38 + fVar44 * -3.0 + 1.0;
                  lVar26 = (long)(int)((int)fVar37 + 2U + iVar23);
                  fVar46 = fVar38 * 3.0 + fVar38 * -2.0;
                  fVar43 = fVar38 * -2.0 + fVar38;
                  fVar38 = fVar38 - fVar44;
                  fVar37 = *(float *)((long)p_Var35 + lVar32 * 0x18 + 0x10);
                  fVar49 = *(float *)((long)p_Var35 + lVar22 * 0x18 + 0x10);
                  fVar44 = *(float *)((long)&p_Var28[3]._M_next + 4);
                  fVar50 = *(float *)((long)p_Var35 + lVar26 * 0x18 + 0x10);
                  fVar3 = *(float *)((long)p_Var35 + (long)((int)fVar48 + iVar23) * 0x18 + 0x10);
                  uVar4 = *(undefined8 *)((long)p_Var35 + lVar32 * 0x18 + 8);
                  uVar5 = *(undefined8 *)((long)p_Var35 + lVar22 * 0x18 + 8);
                  fVar51 = (float)uVar4;
                  fVar52 = (float)((ulong)uVar4 >> 0x20);
                  uVar4 = *(undefined8 *)((long)p_Var35 + lVar26 * 0x18 + 8);
                  uVar6 = *(undefined8 *)((long)p_Var35 + (long)((int)fVar48 + iVar23) * 0x18 + 8);
                  fVar48 = (float)uVar6;
                  fVar53 = (float)((ulong)uVar6 >> 0x20);
                  *(ulong *)((long)paVar18 + lVar29 + -8) =
                       CONCAT44(fVar38 * ((float)((ulong)uVar4 >> 0x20) - fVar53) * fVar44 +
                                fVar43 * (fVar52 - (float)((ulong)uVar5 >> 0x20)) * fVar44 +
                                fVar46 * fVar52 + fVar45 * fVar53,
                                fVar38 * ((float)uVar4 - fVar48) * fVar44 +
                                fVar43 * (fVar51 - (float)uVar5) * fVar44 +
                                fVar46 * fVar51 + fVar45 * fVar48);
                  *(float *)((long)&paVar18->mTime + lVar29) =
                       (fVar50 - fVar3) * fVar44 * fVar38 +
                       (fVar37 - fVar49) * fVar44 * fVar43 + fVar37 * fVar46 + fVar3 * fVar45;
                  *(double *)((long)paVar18 + lVar29 + -0x10) = (double)(uVar20 & 0xffffffff);
                  uVar20 = uVar20 + 1;
                  lVar29 = lVar29 + 0x18;
                  paVar15 = local_110;
                } while (uVar20 < (uint)(local_110->mTransformation).a1);
              }
              goto LAB_004124c2;
            }
            pLVar14 = DefaultLogger::get();
            Logger::warn(pLVar14,"IRR: Spline animators with no points defined");
            uVar20 = local_d8;
            paVar15 = local_110;
            if (local_110 != (aiNode *)0x0) {
              aiNodeAnim::~aiNodeAnim((aiNodeAnim *)local_110);
            }
            operator_delete(paVar15);
            break;
          default:
switchD_00411817_default:
            uVar20 = local_d8;
            if (paVar15 != (aiNode *)0x0) goto LAB_004124c2;
          }
          local_ec = local_ec + 1;
          p_Var35 = local_e0;
LAB_004124f8:
          p_Var28 = p_Var28->_M_next;
        } while (p_Var28 != p_Var35);
      }
    }
  }
  return;
}

Assistant:

void IRRImporter::ComputeAnimations(Node* root, aiNode* real, std::vector<aiNodeAnim*>& anims)
{
    ai_assert(nullptr != root && nullptr != real);

    // XXX totally WIP - doesn't produce proper results, need to evaluate
    // whether there's any use for Irrlicht's proprietary scene format
    // outside Irrlicht ...
    // This also applies to the above function of FindSuitableMultiple and ClampSpline which are
    // solely used in this function

    if (root->animators.empty()) {
        return;
    }
    unsigned int total( 0 );
    for (std::list<Animator>::iterator it = root->animators.begin();it != root->animators.end(); ++it)  {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)   {
            ASSIMP_LOG_WARN("IRR: Skipping unknown or unsupported animator");
            continue;
        }
        ++total;
    }
    if (!total) {
        return;
    } else if (1 == total)    {
        ASSIMP_LOG_WARN("IRR: Adding dummy nodes to simulate multiple animators");
    }

    // NOTE: 1 tick == i millisecond

    unsigned int cur = 0;
    for (std::list<Animator>::iterator it = root->animators.begin();
        it != root->animators.end(); ++it)
    {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)continue;

        Animator& in = *it ;
        aiNodeAnim* anim = new aiNodeAnim();

        if (cur != total-1) {
            // Build a new name - a prefix instead of a suffix because it is
            // easier to check against
            anim->mNodeName.length = ::ai_snprintf(anim->mNodeName.data, MAXLEN,
                "$INST_DUMMY_%i_%s",total-1,
                (root->name.length() ? root->name.c_str() : ""));

            // we'll also need to insert a dummy in the node hierarchy.
            aiNode* dummy = new aiNode();

            for (unsigned int i = 0; i < real->mParent->mNumChildren;++i)
                if (real->mParent->mChildren[i] == real)
                    real->mParent->mChildren[i] = dummy;

            dummy->mParent = real->mParent;
            dummy->mName = anim->mNodeName;

            dummy->mNumChildren = 1;
            dummy->mChildren = new aiNode*[dummy->mNumChildren];
            dummy->mChildren[0] = real;

            // the transformation matrix of the dummy node is the identity

            real->mParent = dummy;
        }
        else anim->mNodeName.Set(root->name);
        ++cur;

        switch (in.type)    {
        case Animator::ROTATION:
            {
                // -----------------------------------------------------
                // find out how long a full rotation will take
                // This is the least common multiple of 360.f and all
                // three euler angles. Although we'll surely find a
                // possible multiple (haha) it could be somewhat large
                // for our purposes. So we need to modify the angles
                // here in order to get good results.
                // -----------------------------------------------------
                int angles[3];
                angles[0] = (int)(in.direction.x*100);
                angles[1] = (int)(in.direction.y*100);
                angles[2] = (int)(in.direction.z*100);

                angles[0] %= 360;
                angles[1] %= 360;
                angles[2] %= 360;

                if ( (angles[0]*angles[1]) != 0 && (angles[1]*angles[2]) != 0 )
                {
                    FindSuitableMultiple(angles[0]);
                    FindSuitableMultiple(angles[1]);
                    FindSuitableMultiple(angles[2]);
                }

                int lcm = 360;

                if (angles[0])
                    lcm  = Math::lcm(lcm,angles[0]);

                if (angles[1])
                    lcm  = Math::lcm(lcm,angles[1]);

                if (angles[2])
                    lcm  = Math::lcm(lcm,angles[2]);

                if (360 == lcm)
                    break;

#if 0
                // This can be a division through zero, but we don't care
                float f1 = (float)lcm / angles[0];
                float f2 = (float)lcm / angles[1];
                float f3 = (float)lcm / angles[2];
#endif

                // find out how many time units we'll need for the finest
                // track (in seconds) - this defines the number of output
                // keys (fps * seconds)
                float max  = 0.f;
                if (angles[0])
                    max = (float)lcm / angles[0];
                if (angles[1])
                    max = std::max(max, (float)lcm / angles[1]);
                if (angles[2])
                    max = std::max(max, (float)lcm / angles[2]);

                anim->mNumRotationKeys = (unsigned int)(max*fps);
                anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];

                // begin with a zero angle
                aiVector3D angle;
                for (unsigned int i = 0; i < anim->mNumRotationKeys;++i)
                {
                    // build the quaternion for the given euler angles
                    aiQuatKey& q = anim->mRotationKeys[i];

                    q.mValue = aiQuaternion(angle.x, angle.y, angle.z);
                    q.mTime = (double)i;

                    // increase the angle
                    angle += in.direction;
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_CIRCLE:
            {
                // -----------------------------------------------------
                // Find out how much time we'll need to perform a
                // full circle.
                // -----------------------------------------------------
                const double seconds = (1. / in.speed) / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                // from Irrlicht, what else should we do than copying it?
                aiVector3D vecU,vecV;
                if (in.direction.y) {
                    vecV = aiVector3D(50,0,0) ^ in.direction;
                }
                else vecV = aiVector3D(0,50,00) ^ in.direction;
                vecV.Normalize();
                vecU = (vecV ^ in.direction).Normalize();

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;

                    const ai_real t = (ai_real) ( in.speed * key.mTime );
                    key.mValue = in.circleCenter  + in.circleRadius * ((vecU * std::cos(t)) + (vecV * std::sin(t)));
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_STRAIGHT:
            {
                anim->mPostState = anim->mPreState = (in.loop ? aiAnimBehaviour_REPEAT : aiAnimBehaviour_CONSTANT);
                const double seconds = in.timeForWay / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                aiVector3D diff = in.direction - in.circleCenter;
                const ai_real lengthOfWay = diff.Length();
                diff.Normalize();

                const double timeFactor = lengthOfWay / in.timeForWay;

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;
                    key.mValue = in.circleCenter + diff * ai_real(timeFactor * key.mTime);
                }
            }
            break;

        case Animator::FOLLOW_SPLINE:
            {
                // repeat outside the defined time range
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
                const int size = (int)in.splineKeys.size();
                if (!size)  {
                    // We have no point in the spline. That's bad. Really bad.
                    ASSIMP_LOG_WARN("IRR: Spline animators with no points defined");

                    delete anim;
                    anim = nullptr;
                    break;
                }
                else if (size == 1) {
                    // We have just one point in the spline so we don't need the full calculation
                    anim->mNumPositionKeys = 1;
                    anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                    anim->mPositionKeys[0].mValue = in.splineKeys[0].mValue;
                    anim->mPositionKeys[0].mTime  = 0.f;
                    break;
                }

                unsigned int ticksPerFull = 15;
                anim->mNumPositionKeys = (unsigned int) ( ticksPerFull * fps );
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)
                {
                    aiVectorKey& key = anim->mPositionKeys[i];

                    const ai_real dt = (i * in.speed * ai_real( 0.001 ) );
                    const ai_real u = dt - std::floor(dt);
                    const int idx = (int)std::floor(dt) % size;

                    // get the 4 current points to evaluate the spline
                    const aiVector3D& p0 = in.splineKeys[ ClampSpline( idx - 1, size ) ].mValue;
                    const aiVector3D& p1 = in.splineKeys[ ClampSpline( idx + 0, size ) ].mValue;
                    const aiVector3D& p2 = in.splineKeys[ ClampSpline( idx + 1, size ) ].mValue;
                    const aiVector3D& p3 = in.splineKeys[ ClampSpline( idx + 2, size ) ].mValue;

                    // compute polynomials
                    const ai_real u2 = u*u;
                    const ai_real u3 = u2*2;

                    const ai_real h1 = ai_real( 2.0 ) * u3 - ai_real( 3.0 ) * u2 + ai_real( 1.0 );
                    const ai_real h2 = ai_real( -2.0 ) * u3 + ai_real( 3.0 ) * u3;
                    const ai_real h3 = u3 - ai_real( 2.0 ) * u3;
                    const ai_real h4 = u3 - u2;

                    // compute the spline tangents
                    const aiVector3D t1 = ( p2 - p0 ) * in.tightness;
                    aiVector3D t2 = ( p3 - p1 ) * in.tightness;

                    // and use them to get the interpolated point
                    t2 = (h1 * p1 + p2 * h2 + t1 * h3 + h4 * t2);

                    // build a simple translation matrix from it
                    key.mValue = t2;
                    key.mTime  = (double) i;
                }
            }
            break;
        default:
            // UNKNOWN , OTHER
            break;
        };
        if (anim)   {
            anims.push_back(anim);
            ++total;
        }
    }
}